

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

void init_stb(void)

{
  int iVar1;
  
  if (init_stb()::done != '\0') {
    return;
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&init_stb::mutex);
  if (iVar1 == 0) {
    if (init_stb()::done == '\0') {
      memset(stbi__zdefault_length,8,0x90);
      builtin_memcpy(stbi__zdefault_length + 0x90,
                     "\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                     ,0x90);
      builtin_memcpy(stbi__zdefault_distance,
                     "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                     ,0x20);
      init_stb()::done = '\x01';
    }
    pthread_mutex_unlock((pthread_mutex_t *)&init_stb::mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

static void init_stb()
{
  static bool done = false;
  static std::mutex mutex;

  if (!done)
  {
    mutex.lock();
    if (!done)
    {
      stbi__init_zdefaults();
      done = true;
    }
    mutex.unlock();
  }
}